

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZParFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>::
TPZParFrontStructMatrix
          (TPZParFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_> *this,
          TPZCompMesh *mesh)

{
  *(undefined8 *)&this->field_0x258 = 0x1803ad8;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x1803ba0;
  *(undefined4 *)&this->field_0x260 = 0;
  this->field_0x264 = 1;
  TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
            (&this->
              super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>,
             &PTR_construction_vtable_104__01800c00,mesh);
  *(undefined8 *)&this->field_0x258 = 0x1800b88;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x18009a0;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0 = 0x1800a88;
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)
             &(this->
              super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
              field_0xd0);
  TPZStack<long,_10>::TPZStack(&this->felnum);
  TPZStack<TPZElementMatrix_*,_10>::TPZStack(&this->fekstack);
  TPZStack<TPZElementMatrix_*,_10>::TPZStack(&this->fefstack);
  this->fMaxStackSize = 500;
  *(undefined4 *)
   ((long)&(this->
           super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>).
           super_TPZStructMatrixT<double>.super_TPZStructMatrix.fMesh +
   *(long *)(*(long *)&(this->
                       super_TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>
                       ).super_TPZStructMatrixT<double>.super_TPZStructMatrix + -0x60)) = 3;
  return;
}

Assistant:

TPZParFrontStructMatrix<TFront,TVar,TPar>::TPZParFrontStructMatrix(TPZCompMesh *mesh): TPZFrontStructMatrix<TFront,TVar,TPar>(mesh)
{
	fMaxStackSize = 500;
	TPZStructMatrix::SetNumThreads(3);
}